

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::EndComboPreview(void)

{
  ImVec2 *pIVar1;
  float *pfVar2;
  float fVar3;
  int iVar4;
  ImGuiWindow *pIVar5;
  ImDrawList *this;
  ImVec2 IVar6;
  float fVar7;
  float fVar8;
  ImGuiContext *pIVar9;
  ImDrawCmd *pIVar10;
  ImDrawCmd *pIVar11;
  
  pIVar9 = GImGui;
  pIVar5 = GImGui->CurrentWindow;
  fVar3 = (GImGui->ComboPreviewData).PreviewRect.Max.x;
  pIVar1 = &(pIVar5->DC).CursorMaxPos;
  if ((pIVar1->x <= fVar3 && fVar3 != pIVar1->x) &&
     (fVar3 = (GImGui->ComboPreviewData).PreviewRect.Max.y, pfVar2 = &(pIVar5->DC).CursorMaxPos.y,
     *pfVar2 <= fVar3 && fVar3 != *pfVar2)) {
    this = pIVar5->DrawList;
    iVar4 = (this->CmdBuffer).Size;
    if (1 < iVar4) {
      pIVar10 = ImVector<ImDrawCmd>::operator[](&this->CmdBuffer,iVar4 + -2);
      pIVar11 = ImVector<ImDrawCmd>::operator[](&this->CmdBuffer,(this->CmdBuffer).Size + -1);
      fVar3 = (pIVar10->ClipRect).y;
      fVar7 = (pIVar10->ClipRect).z;
      fVar8 = (pIVar10->ClipRect).w;
      (pIVar11->ClipRect).x = (pIVar10->ClipRect).x;
      (pIVar11->ClipRect).y = fVar3;
      (pIVar11->ClipRect).z = fVar7;
      (pIVar11->ClipRect).w = fVar8;
      fVar3 = (pIVar10->ClipRect).y;
      fVar7 = (pIVar10->ClipRect).z;
      fVar8 = (pIVar10->ClipRect).w;
      (this->_CmdHeader).ClipRect.x = (pIVar10->ClipRect).x;
      (this->_CmdHeader).ClipRect.y = fVar3;
      (this->_CmdHeader).ClipRect.z = fVar7;
      (this->_CmdHeader).ClipRect.w = fVar8;
      ImDrawList::_TryMergeDrawCmds(this);
    }
  }
  PopClipRect();
  (pIVar5->DC).CursorPos = (pIVar9->ComboPreviewData).BackupCursorPos;
  IVar6 = ImMax(&(pIVar5->DC).CursorMaxPos,&(pIVar9->ComboPreviewData).BackupCursorMaxPos);
  (pIVar5->DC).CursorMaxPos = IVar6;
  (pIVar5->DC).CursorPosPrevLine = (pIVar9->ComboPreviewData).BackupCursorPosPrevLine;
  (pIVar5->DC).PrevLineTextBaseOffset = (pIVar9->ComboPreviewData).BackupPrevLineTextBaseOffset;
  (pIVar5->DC).LayoutType = (pIVar9->ComboPreviewData).BackupLayout;
  (pIVar9->ComboPreviewData).PreviewRect.Min.x = 0.0;
  (pIVar9->ComboPreviewData).PreviewRect.Min.y = 0.0;
  (pIVar9->ComboPreviewData).PreviewRect.Max.x = 0.0;
  (pIVar9->ComboPreviewData).PreviewRect.Max.y = 0.0;
  return;
}

Assistant:

void ImGui::EndComboPreview()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiComboPreviewData* preview_data = &g.ComboPreviewData;

    // FIXME: Using CursorMaxPos approximation instead of correct AABB which we will store in ImDrawCmd in the future
    ImDrawList* draw_list = window->DrawList;
    if (window->DC.CursorMaxPos.x < preview_data->PreviewRect.Max.x && window->DC.CursorMaxPos.y < preview_data->PreviewRect.Max.y)
        if (draw_list->CmdBuffer.Size > 1) // Unlikely case that the PushClipRect() didn't create a command
        {
            draw_list->_CmdHeader.ClipRect = draw_list->CmdBuffer[draw_list->CmdBuffer.Size - 1].ClipRect = draw_list->CmdBuffer[draw_list->CmdBuffer.Size - 2].ClipRect;
            draw_list->_TryMergeDrawCmds();
        }
    PopClipRect();
    window->DC.CursorPos = preview_data->BackupCursorPos;
    window->DC.CursorMaxPos = ImMax(window->DC.CursorMaxPos, preview_data->BackupCursorMaxPos);
    window->DC.CursorPosPrevLine = preview_data->BackupCursorPosPrevLine;
    window->DC.PrevLineTextBaseOffset = preview_data->BackupPrevLineTextBaseOffset;
    window->DC.LayoutType = preview_data->BackupLayout;
    preview_data->PreviewRect = ImRect();
}